

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall
minja::ForTemplateToken::ForTemplateToken
          (ForTemplateToken *this,Location *loc,SpaceHandling pre,SpaceHandling post,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *vns,shared_ptr<minja::Expression> *iter,shared_ptr<minja::Expression> *c,bool r)

{
  byte bVar1;
  shared_ptr<minja::Expression> *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000008;
  byte in_stack_00000010;
  undefined7 in_stack_00000011;
  Location *in_stack_ffffffffffffffc0;
  Type in_stack_ffffffffffffffcc;
  undefined7 in_stack_ffffffffffffffd0;
  
  bVar1 = in_stack_00000010 & 1;
  TemplateToken::TemplateToken
            ((TemplateToken *)
             (CONCAT17(in_stack_00000010,in_stack_ffffffffffffffd0) & 0x1ffffffffffffff),
             in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,
             (SpaceHandling)((ulong)in_RDI >> 0x20),(SpaceHandling)in_RDI);
  (in_RDI->super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR__ForTemplateToken_004440a0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)CONCAT71(in_stack_00000011,in_stack_00000010),in_stack_00000008);
  std::shared_ptr<minja::Expression>::shared_ptr
            ((shared_ptr<minja::Expression> *)in_stack_ffffffffffffffc0,in_RDI);
  std::shared_ptr<minja::Expression>::shared_ptr
            ((shared_ptr<minja::Expression> *)in_stack_ffffffffffffffc0,in_RDI);
  *(byte *)&in_RDI[6].super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = bVar1 & 1;
  return;
}

Assistant:

ForTemplateToken(const Location & loc, SpaceHandling pre, SpaceHandling post, const std::vector<std::string> & vns, std::shared_ptr<Expression> && iter,
      std::shared_ptr<Expression> && c, bool r)
      : TemplateToken(Type::For, loc, pre, post), var_names(vns), iterable(std::move(iter)), condition(std::move(c)), recursive(r) {}